

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_aux_mesh.cxx
# Opt level: O2

void __thiscall level_aux_mesh::build(level_aux_mesh *this,xr_level_hom *hom)

{
  level_aux_mesh *this_00;
  bool bVar1;
  long lVar2;
  fvector3 *right;
  uint32_t face_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> refs;
  b_face face;
  value_type_conflict2 local_a8;
  uint local_a4;
  xr_level_hom *local_a0;
  level_aux_mesh *local_98;
  b_face_vec *local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  b_face local_70;
  
  local_a8 = 0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
             (ulong)(hom->m_num_polys * 3));
  local_90 = &(this->super_xr_mesh_builder).m_faces;
  std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
  reserve(local_90,(ulong)hom->m_num_polys);
  xray_re::xr_mesh_builder::b_face::b_face(&local_70);
  right = &(hom->m_polys->field_0).field_0.v2;
  local_a0 = hom;
  local_98 = this;
  for (lVar2 = (ulong)hom->m_num_polys * 0x28; this_00 = local_98, lVar2 != 0; lVar2 = lVar2 + -0x28
      ) {
    bVar1 = xray_re::_vector3<float>::operator==((_vector3<float> *)(right + -2),right + -1);
    if (!bVar1) {
      bVar1 = xray_re::_vector3<float>::operator==((_vector3<float> *)(right + -2),right);
      if (!bVar1) {
        bVar1 = xray_re::_vector3<float>::operator==(right + -1,right);
        if (!bVar1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,&local_a8);
          local_a4 = local_a8 | 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,&local_a4);
          local_a4 = local_a8 | 2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,&local_a4);
          local_a8 = local_a8 + 4;
          local_70.field_1.field_1.sgroup._2_2_ = (ushort)(*(int *)(right + 1) << 3) & 8;
          local_70.field_1.field_1.surf_idx = 0;
          local_70.field_1.field_1.sgroup._0_2_ = 0;
          std::
          vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
          ::push_back(local_90,&local_70);
        }
      }
    }
    right = (fvector3 *)((long)(right + 3) + 4);
  }
  if (local_a8 != 0) {
    compact_vertices<xray_re::hom_poly>
              (local_98,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
               local_a0->m_polys);
    create_uvs(this_00);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void level_aux_mesh::build(const xr_level_hom& hom)
{
	uint32_t face_idx = 0;
	std::vector<uint32_t> refs;
	refs.reserve(3*hom.num_polys());
	m_faces.reserve(hom.num_polys());
	b_face face;
	for (const hom_poly *it = hom.polys(), *end = it + hom.num_polys(); it != end; ++it) {
		if (it->v0 == it->v1 || it->v0 == it->v2 || it->v1 == it->v2)
			continue;
		refs.push_back(face_idx);
		refs.push_back(face_idx | 1);
		refs.push_back(face_idx | 2);
		face_idx += 4;
		face.surface.set(0, 0, 0, (it->flags & 0x1) ? RSF_TWO_SIDED : 0);
		m_faces.push_back(face);
	}
	if (face_idx) {
		compact_vertices(refs, hom.polys());
		create_uvs();
	}
}